

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O0

bool __thiscall raptor::TcpServer::SetUserData(TcpServer *this,ConnectionId cid,void *ptr)

{
  element_type *this_00;
  undefined1 local_40 [8];
  shared_ptr<raptor::Connection> con;
  uint32_t index;
  void *ptr_local;
  ConnectionId cid_local;
  TcpServer *this_local;
  
  con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       CheckConnectionId(this,cid);
  if (con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
      == 0xffffffff) {
    this_local._7_1_ = false;
  }
  else {
    GetConnection((TcpServer *)local_40,(uint32_t)this);
    this_local._7_1_ = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
    if (this_local._7_1_) {
      this_00 = std::
                __shared_ptr_access<raptor::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<raptor::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_40);
      Connection::SetUserData(this_00,ptr);
    }
    std::shared_ptr<raptor::Connection>::~shared_ptr((shared_ptr<raptor::Connection> *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool TcpServer::SetUserData(ConnectionId cid, void* ptr) {
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        return false;
    }

    auto con = GetConnection(index);
    if (con) {
        con->SetUserData(ptr);
        return true;
    }
    return false;
}